

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void jemalloc_prefork(void)

{
  uint uVar1;
  arena_t *tsdn;
  long *in_FS_OFFSET;
  arena_t *arena;
  uint narenas;
  uint j;
  uint i;
  tsd_t *tsd;
  uint8_t state;
  tsd_t *tsd_1;
  arena_t *in_stack_ffffffffffffff08;
  tsd_t *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  uint local_e0;
  uint local_dc;
  tsdn_t *in_stack_ffffffffffffff30;
  tsd_t *local_28;
  
  local_28 = (tsd_t *)*in_FS_OFFSET;
  if ((local_28->state).repr != '\0') {
    local_28 = tsd_fetch_slow(in_stack_ffffffffffffff10,
                              SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
  }
  uVar1 = narenas_total_get();
  witness_prefork(&local_28->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd);
  ctl_prefork((tsdn_t *)0x2140fc);
  tcache_prefork((tsdn_t *)0x214116);
  malloc_mutex_prefork
            ((tsdn_t *)in_stack_ffffffffffffff10,(malloc_mutex_t *)in_stack_ffffffffffffff08);
  background_thread_prefork0((tsdn_t *)CONCAT44(uVar1,in_stack_ffffffffffffff18));
  prof_prefork0((tsdn_t *)local_28);
  background_thread_prefork1((tsdn_t *)in_stack_ffffffffffffff10);
  for (local_dc = 0; local_dc < 8; local_dc = local_dc + 1) {
    for (local_e0 = 0; local_e0 < uVar1; local_e0 = local_e0 + 1) {
      tsdn = arena_get(in_stack_ffffffffffffff30,(uint)((ulong)local_28 >> 0x20),
                       SUB81((ulong)local_28 >> 0x18,0));
      if (tsdn != (arena_t *)0x0) {
        in_stack_ffffffffffffff08 = (arena_t *)(ulong)local_dc;
        switch(in_stack_ffffffffffffff08) {
        case (arena_t *)0x0:
          arena_prefork0((tsdn_t *)tsdn,in_stack_ffffffffffffff08);
          break;
        case (arena_t *)0x1:
          arena_prefork1((tsdn_t *)tsdn,in_stack_ffffffffffffff08);
          break;
        case (arena_t *)0x2:
          arena_prefork2((tsdn_t *)tsdn,in_stack_ffffffffffffff08);
          break;
        case (arena_t *)0x3:
          arena_prefork3((tsdn_t *)tsdn,in_stack_ffffffffffffff08);
          break;
        case (arena_t *)0x4:
          arena_prefork4((tsdn_t *)tsdn,in_stack_ffffffffffffff08);
          break;
        case (arena_t *)0x5:
          arena_prefork5((tsdn_t *)tsdn,in_stack_ffffffffffffff08);
          break;
        case (arena_t *)0x6:
          arena_prefork6((tsdn_t *)tsdn,in_stack_ffffffffffffff08);
          break;
        case (arena_t *)0x7:
          arena_prefork7((tsdn_t *)tsdn,in_stack_ffffffffffffff08);
        }
      }
    }
  }
  prof_prefork1((tsdn_t *)local_28);
  tsd_prefork((tsd_t *)in_stack_ffffffffffffff08);
  return;
}

Assistant:

void
jemalloc_prefork(void)
#else
JEMALLOC_EXPORT void
_malloc_prefork(void)
#endif
{
	tsd_t *tsd;
	unsigned i, j, narenas;
	arena_t *arena;

#ifdef JEMALLOC_MUTEX_INIT_CB
	if (!malloc_initialized()) {
		return;
	}
#endif
	assert(malloc_initialized());

	tsd = tsd_fetch();

	narenas = narenas_total_get();

	witness_prefork(tsd_witness_tsdp_get(tsd));
	/* Acquire all mutexes in a safe order. */
	ctl_prefork(tsd_tsdn(tsd));
	tcache_prefork(tsd_tsdn(tsd));
	malloc_mutex_prefork(tsd_tsdn(tsd), &arenas_lock);
	if (have_background_thread) {
		background_thread_prefork0(tsd_tsdn(tsd));
	}
	prof_prefork0(tsd_tsdn(tsd));
	if (have_background_thread) {
		background_thread_prefork1(tsd_tsdn(tsd));
	}
	/* Break arena prefork into stages to preserve lock order. */
	for (i = 0; i < 8; i++) {
		for (j = 0; j < narenas; j++) {
			if ((arena = arena_get(tsd_tsdn(tsd), j, false)) !=
			    NULL) {
				switch (i) {
				case 0:
					arena_prefork0(tsd_tsdn(tsd), arena);
					break;
				case 1:
					arena_prefork1(tsd_tsdn(tsd), arena);
					break;
				case 2:
					arena_prefork2(tsd_tsdn(tsd), arena);
					break;
				case 3:
					arena_prefork3(tsd_tsdn(tsd), arena);
					break;
				case 4:
					arena_prefork4(tsd_tsdn(tsd), arena);
					break;
				case 5:
					arena_prefork5(tsd_tsdn(tsd), arena);
					break;
				case 6:
					arena_prefork6(tsd_tsdn(tsd), arena);
					break;
				case 7:
					arena_prefork7(tsd_tsdn(tsd), arena);
					break;
				default: not_reached();
				}
			}
		}
	}
	prof_prefork1(tsd_tsdn(tsd));
	tsd_prefork(tsd);
}